

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O2

void __thiscall
icu_63::TransliteratorRegistry::registerEntry
          (TransliteratorRegistry *this,UnicodeString *source,UnicodeString *target,
          UnicodeString *variant,TransliteratorEntry *adopted,UBool visible)

{
  ConstChar16Ptr local_c8;
  UChar *local_c0;
  UnicodeString s;
  UnicodeString ID;
  
  ID.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  ID.fUnion.fStackFields.fLengthAndFlags = 2;
  icu_63::UnicodeString::UnicodeString(&s,source);
  if (-1 < s.fUnion.fStackFields.fLengthAndFlags) {
    s.fUnion.fFields.fLength = (int)s.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (s.fUnion.fFields.fLength == 0) {
    local_c8.p_ = L"Any";
    icu_63::UnicodeString::setTo(&s,'\x01',&local_c8,3);
    local_c0 = local_c8.p_;
  }
  TransliteratorIDParser::STVtoID(source,target,variant,&ID);
  registerEntry(this,&ID,&s,target,variant,adopted,visible);
  icu_63::UnicodeString::~UnicodeString(&s);
  icu_63::UnicodeString::~UnicodeString(&ID);
  return;
}

Assistant:

void TransliteratorRegistry::registerEntry(const UnicodeString& source,
                                           const UnicodeString& target,
                                           const UnicodeString& variant,
                                           TransliteratorEntry* adopted,
                                           UBool visible) {
    UnicodeString ID;
    UnicodeString s(source);
    if (s.length() == 0) {
        s.setTo(TRUE, ANY, 3);
    }
    TransliteratorIDParser::STVtoID(source, target, variant, ID);
    registerEntry(ID, s, target, variant, adopted, visible);
}